

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryFlatUpdateLoop<duckdb::FirstState<int>,int,duckdb::FirstFunction<true,false>>
               (int *idata,AggregateInputData *aggr_input_data,FirstState<int> *state,idx_t count,
               ValidityMask *mask)

{
  ulong uVar1;
  idx_t entry_idx;
  ulong uVar2;
  ulong uVar3;
  AggregateUnaryInput local_48;
  
  local_48.input_idx = 0;
  uVar1 = 0;
  local_48.input = aggr_input_data;
  local_48.input_mask = mask;
  for (uVar2 = 0; uVar2 != count + 0x3f >> 6; uVar2 = uVar2 + 1) {
    uVar3 = uVar1 + 0x40;
    if (count <= uVar1 + 0x40) {
      uVar3 = count;
    }
    while (uVar1 < uVar3) {
      FirstFunction<true,false>::
      Operation<int,duckdb::FirstState<int>,duckdb::FirstFunction<true,false>>
                (state,idata + uVar1,&local_48);
      uVar1 = local_48.input_idx + 1;
      local_48.input_idx = uVar1;
    }
  }
  return;
}

Assistant:

static inline void UnaryFlatUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                       STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask) {
		AggregateUnaryInput input(aggr_input_data, mask);
		auto &base_idx = input.input_idx;
		base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (!OP::IgnoreNull() || ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
					}
				}
			}
		}
	}